

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_TestShell::
createTest(TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_TestShell
           *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test *this_00;
  
  this_00 = (TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test
             *)operator_new(0x40,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                            ,0xe7);
  TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test::
  TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, turnOffNewOverloadsCausesNoAdditionalLeaks)
{
    size_t storedAmountOfLeaks = detector->totalMemoryLeaks(mem_leak_period_all);

    char* arrayMemory = new char[100];
    char* nonArrayMemory = new char;
    char* mallocMemory = (char*) cpputest_malloc_location_with_leak_detection(10, "file", 10);
    char* reallocMemory = (char*) cpputest_realloc_location_with_leak_detection(NULLPTR, 10, "file", 10);

    LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all));

    cpputest_free_location_with_leak_detection(mallocMemory, "file", 10);
    cpputest_free_location_with_leak_detection(reallocMemory, "file", 10);
    delete [] arrayMemory;
    delete nonArrayMemory;
}